

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68000_move_to_sr(m68k_info *info)

{
  m68k_info *info_00;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  m68k_op_mem *op;
  m68k_info *in_stack_fffffffffffffff0;
  
  info_00 = (m68k_info *)
            build_init_op(in_stack_fffffffffffffff0,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                          (int)in_stack_ffffffffffffffe8,
                          (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  op = &(info_00->extension).operands[0].mem;
  get_ea_mode_op(info_00,(cs_m68k_op *)op,(uint)((ulong)info_00 >> 0x20),(uint)info_00);
  ((m68k_op_br_disp *)(op + 1))[3].disp = 0;
  op->base_reg = M68K_REG_SR;
  return;
}

Assistant:

static void d68000_move_to_sr(m68k_info *info)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_MOVE, 2, 2);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	get_ea_mode_op(info, op0, info->ir, 2);

	op1->address_mode = M68K_AM_NONE;
	op1->reg = M68K_REG_SR;
}